

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_stack.c
# Opt level: O0

DsStack * ds_stack_create(size_t size)

{
  DsStack *__s;
  void **ppvVar1;
  DsStack *stack;
  size_t size_local;
  
  __s = (DsStack *)malloc(0x18);
  memset(__s,0,0x18);
  if (__s == (DsStack *)0x0) {
    exit(2);
  }
  stack = (DsStack *)size;
  if (size == 0) {
    stack = (DsStack *)0x10;
  }
  ppvVar1 = (void **)malloc(8);
  __s->elems = ppvVar1;
  if (__s->elems == (void **)0x0) {
    exit(2);
  }
  __s->max = (size_t)stack;
  __s->index = 0;
  return __s;
}

Assistant:

DsStack *ds_stack_create(size_t size)
{
    DsStack *stack = (DsStack *)malloc(sizeof(DsStack));
    memset(stack, 0, sizeof(DsStack));
    if (NULL == stack)
        exit(DS_STATUS_OUTMEM);
    if (size <= 0)
        size = 16;
    stack->elems = (void **)malloc(sizeof(void **));
    if (NULL == stack->elems)
        exit(DS_STATUS_OUTMEM);
    stack->max = size;
    stack->index = 0;
    return stack;
}